

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O0

Move * ddSymmSiftingUp(DdManager *table,int y,int xLow)

{
  int y_00;
  DdHalfWord x_00;
  Move *pMVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  int local_60;
  int L;
  int isolated;
  int z;
  int zindex;
  int yindex;
  int xindex;
  int limitSize;
  int gybot;
  int gxtop;
  int i;
  int size;
  int x;
  Move *move;
  Move *moves;
  int xLow_local;
  int y_local;
  DdManager *table_local;
  
  move = (Move *)0x0;
  y_00 = table->invperm[y];
  yindex = table->keys - table->isolated;
  for (xindex = y; (uint)xindex < table->subtables[xindex].next;
      xindex = table->subtables[xindex].next) {
  }
  local_60 = yindex;
  moves._0_4_ = xLow;
  moves._4_4_ = y;
  _xLow_local = table;
  for (L = xLow + 1; L <= xindex; L = L + 1) {
    iVar3 = _xLow_local->invperm[L];
    if ((iVar3 == y_00) || (iVar2 = cuddTestInteract(_xLow_local,iVar3,y_00), iVar2 != 0)) {
      local_60 = local_60 -
                 (_xLow_local->subtables[L].keys - (uint)(_xLow_local->vars[iVar3]->ref == 1));
    }
  }
  i = cuddNextLow(_xLow_local,moves._4_4_);
  do {
    if (i < (int)moves || yindex < local_60) {
      return move;
    }
    x_00 = _xLow_local->subtables[i].next;
    iVar3 = cuddSymmCheck(_xLow_local,i,moves._4_4_);
    if (iVar3 == 0) {
      if ((_xLow_local->subtables[i].next == i) &&
         (_xLow_local->subtables[(int)moves._4_4_].next == moves._4_4_)) {
        iVar3 = _xLow_local->invperm[i];
        iVar2 = cuddSwapInPlace(_xLow_local,i,moves._4_4_);
        if (iVar2 == 0) goto LAB_00a2aa6d;
        iVar4 = cuddTestInteract(_xLow_local,iVar3,y_00);
        if (iVar4 != 0) {
          local_60 = (_xLow_local->subtables[(int)moves._4_4_].keys -
                     (uint)(_xLow_local->vars[iVar3]->ref == 1)) + local_60;
        }
        pDVar5 = cuddDynamicAllocNode(_xLow_local);
        if (pDVar5 == (DdNode *)0x0) goto LAB_00a2aa6d;
        pDVar5->index = i;
        pDVar5->ref = moves._4_4_;
        *(int *)((long)&pDVar5->next + 4) = iVar2;
        (pDVar5->type).kids.T = (DdNode *)move;
        if ((double)yindex * _xLow_local->maxGrowth < (double)iVar2) {
          return (Move *)pDVar5;
        }
        move = (Move *)pDVar5;
        if (iVar2 < yindex) {
          yindex = iVar2;
        }
      }
      else {
        iVar3 = ddSymmGroupMove(_xLow_local,i,moves._4_4_,&move);
        if (iVar3 == 0) {
LAB_00a2aa6d:
          while (move != (Move *)0x0) {
            pMVar1 = move->next;
            move->y = 0;
            *(DdNode **)&move->flags = _xLow_local->nextFree;
            _xLow_local->nextFree = (DdNode *)move;
            move = pMVar1;
          }
          return (Move *)0x1;
        }
        L = move->y;
        do {
          iVar2 = _xLow_local->invperm[L];
          iVar4 = cuddTestInteract(_xLow_local,iVar2,y_00);
          if (iVar4 != 0) {
            local_60 = (_xLow_local->subtables[L].keys - (uint)(_xLow_local->vars[iVar2]->ref == 1))
                       + local_60;
          }
          L = _xLow_local->subtables[L].next;
        } while (L != move->y);
        if ((double)yindex * _xLow_local->maxGrowth < (double)iVar3) {
          return move;
        }
        if (iVar3 < yindex) {
          yindex = iVar3;
        }
      }
    }
    else {
      _xLow_local->subtables[i].next = moves._4_4_;
      gybot = _xLow_local->subtables[(int)moves._4_4_].next;
      while (_xLow_local->subtables[gybot].next != moves._4_4_) {
        gybot = _xLow_local->subtables[gybot].next;
      }
      _xLow_local->subtables[gybot].next = x_00;
    }
    moves._4_4_ = x_00;
    i = cuddNextLow(_xLow_local,x_00);
  } while( true );
}

Assistant:

static Move *
ddSymmSiftingUp(
  DdManager * table,
  int  y,
  int  xLow)
{
    Move *moves;
    Move *move;
    int  x;
    int  size;
    int  i;
    int  gxtop,gybot;
    int  limitSize;
    int  xindex, yindex;
    int  zindex;
    int  z;
    int  isolated;
    int  L;     /* lower bound on DD size */
#ifdef DD_DEBUG
    int  checkL;
#endif


    moves = NULL;
    yindex = table->invperm[y];

    /* Initialize the lower bound.
    ** The part of the DD below the bottom of y' group will not change.
    ** The part of the DD above y that does not interact with y will not
    ** change. The rest may vanish in the best case, except for
    ** the nodes at level xLow, which will not vanish, regardless.
    */
    limitSize = L = table->keys - table->isolated;
    gybot = y;
    while ((unsigned) gybot < table->subtables[gybot].next)
        gybot = table->subtables[gybot].next;
    for (z = xLow + 1; z <= gybot; z++) {
        zindex = table->invperm[z];
        if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
            isolated = table->vars[zindex]->ref == 1;
            L -= table->subtables[z].keys - isolated;
        }
    }

    x = cuddNextLow(table,y);
    while (x >= xLow && L <= limitSize) {
#ifdef DD_DEBUG
        gybot = y;
        while ((unsigned) gybot < table->subtables[gybot].next)
            gybot = table->subtables[gybot].next;
        checkL = table->keys - table->isolated;
        for (z = xLow + 1; z <= gybot; z++) {
            zindex = table->invperm[z];
            if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkL -= table->subtables[z].keys - isolated;
            }
        }
        assert(L == checkL);
#endif
        gxtop = table->subtables[x].next;
        if (cuddSymmCheck(table,x,y)) {
            /* Symmetry found, attach symm groups */
            table->subtables[x].next = y;
            i = table->subtables[y].next;
            while (table->subtables[i].next != (unsigned) y)
                i = table->subtables[i].next;
            table->subtables[i].next = gxtop;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y have self symmetry */
            xindex = table->invperm[x];
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddSymmSiftingUpOutOfMem;
            /* Update the lower bound. */
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[xindex]->ref == 1;
                L += table->subtables[y].keys - isolated;
            }
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto ddSymmSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        } else { /* Group move */
            size = ddSymmGroupMove(table,x,y,&moves);
            if (size == 0) goto ddSymmSiftingUpOutOfMem;
            /* Update the lower bound. */
            z = moves->y;
            do {
                zindex = table->invperm[z];
                if (cuddTestInteract(table,zindex,yindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    L += table->subtables[z].keys - isolated;
                }
                z = table->subtables[z].next;
            } while (z != (int) moves->y);
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        }
        y = gxtop;
        x = cuddNextLow(table,y);
    }

    return(moves);

ddSymmSiftingUpOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(MV_OOM);

}